

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_spi.hpp
# Opt level: O1

AssertionResult * __thiscall
iutest::detail::SPIFailureChecker::GetResult
          (AssertionResult *__return_storage_ptr__,SPIFailureChecker *this,string *substr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestPartResult *value;
  pointer pcVar2;
  char *pcVar3;
  AssertionResult *pAVar4;
  long lVar5;
  AssertionResult *ar;
  ulong uVar6;
  size_t num;
  char *expected;
  ulong local_60;
  char *local_58;
  AssertionResult local_50;
  
  local_58 = "1 non-fatal failure";
  if (this->m_Type == kFatalFailure) {
    local_58 = "1 fatal failure";
  }
  value = (this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
          super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
          _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)value;
  local_60 = (lVar5 >> 4) * -0x5555555555555555;
  if (lVar5 != 0x30) {
    paVar1 = &local_50.m_message.field_2;
    local_50.m_message._M_string_length = 0;
    local_50.m_message.field_2._M_local_buf[0] = '\0';
    local_50.m_result = false;
    local_50.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar4 = AssertionResult::operator<<(&local_50,(char (*) [18])"error: Expected: ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_58);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [12])"\n  Actual: ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_60);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [11])" failures\n");
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.m_message._M_dataplus._M_p,
                      CONCAT71(local_50.m_message.field_2._M_allocated_capacity._1_7_,
                               local_50.m_message.field_2._M_local_buf[0]) + 1);
    }
    if (local_60 == 0) {
      return __return_storage_ptr__;
    }
    lVar5 = 0;
    uVar6 = 0;
    do {
      AssertionResult::operator<<
                (__return_storage_ptr__,
                 (TestPartResult *)
                 ((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).
                           m_results.
                           super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).
                         m_message._M_dataplus + lVar5));
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x30;
    } while (uVar6 < local_60);
    return __return_storage_ptr__;
  }
  if (*(Type *)&(value->super_iuCodeMessage).field_0x2c == this->m_Type) {
    pcVar3 = strstr((value->super_iuCodeMessage).m_message._M_dataplus._M_p,
                    (substr->_M_dataplus)._M_p);
    if (pcVar3 != (char *)0x0) {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_message).field_2;
      (__return_storage_ptr__->m_message)._M_string_length = 0;
      (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->m_result = true;
      return __return_storage_ptr__;
    }
    paVar1 = &local_50.m_message.field_2;
    local_50.m_message._M_string_length = 0;
    local_50.m_message.field_2._M_local_buf[0] = '\0';
    local_50.m_result = false;
    local_50.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar4 = AssertionResult::operator<<(&local_50,(char (*) [18])"error: Expected: ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_58);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [14])" containing \"");
    pAVar4 = AssertionResult::operator<<(pAVar4,substr);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [13])"\"\n  Actual:\n");
    pAVar4 = AssertionResult::operator<<(pAVar4,value);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_message._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    paVar1 = &local_50.m_message.field_2;
    local_50.m_message._M_string_length = 0;
    local_50.m_message.field_2._M_local_buf[0] = '\0';
    local_50.m_result = false;
    local_50.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar4 = AssertionResult::operator<<(&local_50,(char (*) [18])"error: Expected: ");
    pAVar4 = AssertionResult::operator<<(pAVar4,&local_58);
    pAVar4 = AssertionResult::operator<<(pAVar4,(char (*) [13])"\"\n  Actual:\n");
    pAVar4 = AssertionResult::operator<<(pAVar4,value);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar4->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar4->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar4->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_message._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_50.m_message._M_dataplus._M_p,
                  CONCAT71(local_50.m_message.field_2._M_allocated_capacity._1_7_,
                           local_50.m_message.field_2._M_local_buf[0]) + 1);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(const ::std::string& substr)
    {
        const char* expected =
            (m_Type == TestPartResult::kFatalFailure) ? "1 fatal failure" : "1 non-fatal failure";
        const size_t num = count();
        if( num != 1 )
        {
            AssertionResult ar = AssertionFailure() << "error: Expected: " << expected
                << "\n  Actual: " << num << " failures\n";
            for( size_t i=0; i < num; ++i )
            {
                ar << GetTestPartResult(i);
            }
            return ar;
        }

        const TestPartResult& tr = GetTestPartResult(0);
        if( tr.type() != m_Type )
        {
            return AssertionFailure() << "error: Expected: " << expected
                << "\"\n  Actual:\n" << tr;
        }

        if( strstr(tr.message(), substr.c_str()) == NULL )
        {
            return AssertionFailure() << "error: Expected: " << expected
                << " containing \"" << substr
                << "\"\n  Actual:\n" << tr;
        }
        return AssertionSuccess();
    }